

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

string * cmQtAutoGenerator::SettingsFind(string *__return_storage_ptr__,string *content,char *key)

{
  long lVar1;
  ulong uVar2;
  string prefix;
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,key,&local_39);
  std::__cxx11::string::push_back((char)(string *)&local_38);
  lVar1 = std::__cxx11::string::find((char *)content,(ulong)local_38,0);
  if ((lVar1 != -1) && ((ulong)(lVar1 + local_30) < content->_M_string_length)) {
    uVar2 = std::__cxx11::string::find((char)content,10);
    if (uVar2 != lVar1 + local_30 && uVar2 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)content);
      goto LAB_00196116;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00196116:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::SettingsFind(std::string const& content,
                                            const char* key)
{
  std::string prefix(key);
  prefix += ':';
  std::string::size_type pos = content.find(prefix);
  if (pos != std::string::npos) {
    pos += prefix.size();
    if (pos < content.size()) {
      std::string::size_type posE = content.find('\n', pos);
      if ((posE != std::string::npos) && (posE != pos)) {
        return content.substr(pos, posE - pos);
      }
    }
  }
  return std::string();
}